

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O2

void __thiscall
chrono::ChBodyEasySphere::ChBodyEasySphere
          (ChBodyEasySphere *this,void **vtt,double radius,double density,
          shared_ptr<chrono::ChMaterialSurface> *material,ChCollisionSystemType collision_type)

{
  _func_int **pp_Var1;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  ChBody::ChBody(&this->super_ChBody,vtt + 1,collision_type);
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj = pp_Var1;
  (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
  _vptr_ChFrame = (_func_int **)0x1151dd0;
  (this->super_ChBody).super_ChContactable_1vars<6>.super_ChContactable._vptr_ChContactable =
       (_func_int **)0x1151e68;
  (this->super_ChBody).super_ChContactable_1vars<6>.super_ChVariableTupleCarrier_1vars<6>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)(vtable + 0x458);
  (this->super_ChBody).super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 6);
  *(void **)(pp_Var1[-3] + -0x78 +
            (long)(&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                    super_ChFrame<double>.coord + -1) + 0x30) = vtt[7];
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  SetupBody(this,radius,density,true,true,(shared_ptr<chrono::ChMaterialSurface> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

ChBodyEasySphere::ChBodyEasySphere(double radius,
                                   double density,
                                   std::shared_ptr<ChMaterialSurface> material,
                                   collision::ChCollisionSystemType collision_type)
    : ChBody(collision_type) {
    SetupBody(radius, density, true, true, material);
}